

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O2

TestReporter * create_libxml_reporter(char *prefix)

{
  TestReporter *reporter;
  undefined8 *puVar1;
  
  reporter = create_reporter();
  if (reporter != (TestReporter *)0x0) {
    puVar1 = (undefined8 *)malloc(0x10);
    if (puVar1 != (undefined8 *)0x0) {
      reporter->memo = puVar1;
      *puVar1 = default_printer;
      file_prefix = prefix;
      reporter->start_suite = xml_reporter_start_suite;
      reporter->start_test = xml_reporter_start_test;
      reporter->show_fail = xml_show_fail;
      reporter->show_skip = xml_show_skip;
      reporter->show_incomplete = xml_show_incomplete;
      reporter->finish_test = xml_reporter_finish_test;
      reporter->finish_suite = xml_reporter_finish_suite;
      return reporter;
    }
    destroy_reporter(reporter);
  }
  return (TestReporter *)0x0;
}

Assistant:

TestReporter *create_libxml_reporter(const char *prefix) {
    TestReporter *reporter;
    XmlMemo *memo;

    reporter = create_reporter();
    if (reporter == NULL) {
        return NULL;
    }

    memo = (XmlMemo *) malloc(sizeof(XmlMemo));
    if (memo == NULL) {
        destroy_reporter(reporter);
        return NULL;
    }
    reporter->memo = memo;
    memo->printer = &default_printer;

    file_prefix = prefix;
    reporter->start_suite = &xml_reporter_start_suite;
    reporter->start_test = &xml_reporter_start_test;
    reporter->show_fail = &xml_show_fail;
    reporter->show_skip = &xml_show_skip;
    reporter->show_incomplete = &xml_show_incomplete;
    reporter->finish_test = &xml_reporter_finish_test;
    reporter->finish_suite = &xml_reporter_finish_suite;
    return reporter;
}